

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O2

void av1_source_content_sb(AV1_COMP *cpi,MACROBLOCK *x,TileDataEnc *tile_data,int mi_row,int mi_col)

{
  BLOCK_SIZE BVar1;
  BLOCK_SIZE BVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  YV12_BUFFER_CONFIG *pYVar8;
  YV12_BUFFER_CONFIG *pYVar9;
  MB_MODE_INFO **ppMVar10;
  MB_MODE_INFO *pMVar11;
  SequenceHeader *pSVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  int16_t iVar17;
  ushort uVar18;
  ushort uVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  ushort uVar24;
  SOURCE_SAD SVar25;
  uint8_t *puVar26;
  ulong uVar27;
  int iVar28;
  uint8_t *puVar29;
  ulong uVar30;
  uint uVar31;
  uint uVar32;
  bool bVar33;
  bool bVar34;
  short sVar35;
  short sVar42;
  short sVar43;
  short sVar44;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int shift_y [2];
  uint uStack_80;
  uint uStack_7c;
  uint tmp_sse;
  int shift_x [2];
  
  pYVar8 = cpi->source;
  pYVar9 = cpi->last_source;
  if ((pYVar9->field_0).field_0.y_width != (pYVar8->field_0).field_0.y_width) {
    return;
  }
  if ((pYVar9->field_1).field_0.y_height != (pYVar8->field_1).field_0.y_height) {
    return;
  }
  if ((((x->e_mbd).cur_buf)->flags & 8) != 0) {
    return;
  }
  BVar1 = ((cpi->common).seq_params)->sb_size;
  iVar23 = (pYVar8->field_4).field_0.y_stride;
  iVar7 = (pYVar9->field_4).field_0.y_stride;
  bVar33 = (cpi->sf).rt_sf.increase_source_sad_thresh == 0;
  uVar21 = 2000000;
  if (bVar33) {
    uVar21 = 1000000;
  }
  uVar32 = 200000;
  if (bVar33) {
    uVar32 = 100000;
  }
  uVar31 = 20000;
  if (bVar33) {
    uVar31 = 10000;
  }
  puVar29 = (pYVar8->field_5).buffers[0] + (iVar23 * mi_row * 4 + mi_col * 4);
  puVar26 = (pYVar9->field_5).buffers[0] + (mi_row * 4 * iVar7 + mi_col * 4);
  uVar20 = (*cpi->ppi->fn_ptr[BVar1].vf)(puVar29,iVar23,puVar26,iVar7,&tmp_sse);
  if ((tmp_sse < 36000) && ((x->content_state_sb).source_sad_rd = kLowSad, tmp_sse == 0)) {
    (x->content_state_sb).source_sad_nonrd = kZeroSad;
    return;
  }
  if (tmp_sse < uVar31) {
    SVar25 = kVeryLowSad;
  }
  else if (tmp_sse < uVar32) {
    SVar25 = kLowSad;
  }
  else {
    if (tmp_sse <= uVar21) goto LAB_001a1616;
    SVar25 = kHighSad;
  }
  (x->content_state_sb).source_sad_nonrd = SVar25;
LAB_001a1616:
  uVar32 = tmp_sse - uVar20;
  if ((uVar20 < tmp_sse >> 1) && (10000 < uVar32)) {
    (x->content_state_sb).lighting_change = 1;
  }
  else if (uVar32 < 5000) {
    (x->content_state_sb).low_sumdiff = 1;
  }
  if (((uVar21 * 7 >> 3 < tmp_sse) && ((x->content_state_sb).lighting_change == 0)) &&
     ((x->content_state_sb).low_sumdiff == 0)) {
    x->sb_force_fixed_part = 0;
  }
  if ((((cpi->sf).rt_sf.use_rtc_tf != 0) && ((cpi->rc).high_source_sad == 0)) &&
     (((cpi->rc).frame_source_sad < 0x4e21 && ((cpi->svc).number_spatial_layers < 2)))) {
    iVar17 = av1_ac_quant_QTX((cpi->common).quant_params.base_qindex,0,
                              ((cpi->common).seq_params)->bit_depth);
    uVar18 = av1_ac_quant_QTX((cpi->ppi->p_rc).avg_frame_qindex[1],0,
                              ((cpi->common).seq_params)->bit_depth);
    if ((cpi->sf).rt_sf.use_rtc_tf == 1) {
      uVar24 = 1000;
      if (uVar18 < 1000) {
        uVar24 = uVar18;
      }
      uVar19 = 0xfa;
      if (0xf9 < (short)uVar18) {
        uVar19 = uVar24;
      }
      uVar21 = (uint)uVar19 * (int)iVar17;
    }
    else {
      uVar21 = iVar17 * 0xfa;
    }
    if ((uVar32 < 0x10) && (uVar20 <= uVar21)) {
      iVar28 = (cpi->common).mi_params.mi_stride;
      iVar22 = iVar28 * mi_row + mi_col;
      ppMVar10 = (cpi->common).mi_params.mi_grid_base;
      bVar34 = true;
      bVar33 = bVar34;
      if (((tile_data->tile_info).mi_row_start < mi_row) &&
         (pMVar11 = ppMVar10[(long)iVar22 - (long)iVar28], 0xc < pMVar11->mode)) {
        uVar30 = *(ulong *)pMVar11->mv;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = uVar30;
        sVar35 = (short)uVar30;
        sVar13 = -sVar35;
        sVar42 = (short)(uVar30 >> 0x10);
        sVar14 = -sVar42;
        sVar43 = (short)(uVar30 >> 0x20);
        sVar15 = -sVar43;
        sVar44 = (short)(uVar30 >> 0x30);
        sVar16 = -sVar44;
        auVar45._0_2_ = (ushort)(sVar13 < sVar35) * sVar35 | (ushort)(sVar13 >= sVar35) * sVar13;
        auVar45._2_2_ = (ushort)(sVar14 < sVar42) * sVar42 | (ushort)(sVar14 >= sVar42) * sVar14;
        auVar45._4_2_ = (ushort)(sVar15 < sVar43) * sVar43 | (ushort)(sVar15 >= sVar43) * sVar15;
        auVar45._6_2_ = (ushort)(sVar16 < sVar44) * sVar44 | (ushort)(sVar16 >= sVar44) * sVar16;
        auVar45._8_8_ = 0;
        auVar36 = pshuflw(auVar36,auVar45,0x50);
        auVar37._0_4_ = auVar36._0_4_;
        auVar37._4_4_ = auVar37._0_4_;
        auVar37._8_4_ = auVar36._4_4_;
        auVar37._12_4_ = auVar36._4_4_;
        auVar37 = auVar37 ^ _DAT_00436680;
        auVar38._0_2_ = -(ushort)(-0x7fe8 < auVar37._0_2_);
        auVar38._2_2_ = -(ushort)(-0x7fe8 < auVar37._2_2_);
        auVar38._4_2_ = -(ushort)(-0x7fe8 < auVar37._4_2_);
        auVar38._6_2_ = -(ushort)(-0x7fe8 < auVar37._6_2_);
        auVar38._8_2_ = -(ushort)(-0x7fe8 < auVar37._8_2_);
        auVar38._10_2_ = -(ushort)(-0x7fe8 < auVar37._10_2_);
        auVar38._12_2_ = -(ushort)(-0x7fe8 < auVar37._12_2_);
        auVar38._14_2_ = -(ushort)(-0x7fe8 < auVar37._14_2_);
        iVar28 = movmskpd((int)pMVar11,auVar38);
        bVar33 = iVar28 == 0;
      }
      if (((tile_data->tile_info).mi_col_start < mi_col) &&
         (pMVar11 = ppMVar10[(long)iVar22 + -1], 0xc < pMVar11->mode)) {
        uVar30 = *(ulong *)pMVar11->mv;
        auVar39._8_8_ = 0;
        auVar39._0_8_ = uVar30;
        sVar35 = (short)uVar30;
        sVar13 = -sVar35;
        sVar42 = (short)(uVar30 >> 0x10);
        sVar14 = -sVar42;
        sVar43 = (short)(uVar30 >> 0x20);
        sVar15 = -sVar43;
        sVar44 = (short)(uVar30 >> 0x30);
        sVar16 = -sVar44;
        auVar46._0_2_ = (ushort)(sVar13 < sVar35) * sVar35 | (ushort)(sVar13 >= sVar35) * sVar13;
        auVar46._2_2_ = (ushort)(sVar14 < sVar42) * sVar42 | (ushort)(sVar14 >= sVar42) * sVar14;
        auVar46._4_2_ = (ushort)(sVar15 < sVar43) * sVar43 | (ushort)(sVar15 >= sVar43) * sVar15;
        auVar46._6_2_ = (ushort)(sVar16 < sVar44) * sVar44 | (ushort)(sVar16 >= sVar44) * sVar16;
        auVar46._8_8_ = 0;
        auVar36 = pshuflw(auVar39,auVar46,0x50);
        auVar40._0_4_ = auVar36._0_4_;
        auVar40._4_4_ = auVar40._0_4_;
        auVar40._8_4_ = auVar36._4_4_;
        auVar40._12_4_ = auVar36._4_4_;
        auVar40 = auVar40 ^ _DAT_00436680;
        auVar41._0_2_ = -(ushort)(-0x7fe8 < auVar40._0_2_);
        auVar41._2_2_ = -(ushort)(-0x7fe8 < auVar40._2_2_);
        auVar41._4_2_ = -(ushort)(-0x7fe8 < auVar40._4_2_);
        auVar41._6_2_ = -(ushort)(-0x7fe8 < auVar40._6_2_);
        auVar41._8_2_ = -(ushort)(-0x7fe8 < auVar40._8_2_);
        auVar41._10_2_ = -(ushort)(-0x7fe8 < auVar40._10_2_);
        auVar41._12_2_ = -(ushort)(-0x7fe8 < auVar40._12_2_);
        auVar41._14_2_ = -(ushort)(-0x7fe8 < auVar40._14_2_);
        iVar28 = movmskpd((int)pMVar11,auVar41);
        bVar34 = iVar28 == 0;
      }
      if ((bool)(bVar34 & bVar33)) {
        pSVar12 = (cpi->common).seq_params;
        BVar2 = pSVar12->sb_size;
        if (cpi->src_sad_blk_64x64 == (uint64_t *)0x0) {
          uVar21 = (*cpi->ppi->fn_ptr[BVar2].sdf)(puVar29,iVar23,puVar26,iVar7);
        }
        else {
          iVar28 = pSVar12->mib_size >> (BVar2 == BLOCK_128X128);
          uVar21 = (uint)cpi->src_sad_blk_64x64
                         [(mi_row / iVar28) *
                          (((cpi->common).mi_params.mi_cols + iVar28 + -1) / iVar28) +
                          mi_col / iVar28];
        }
        shift_x = (int  [2])((long)puVar26 - (long)iVar7);
        (*cpi->ppi->fn_ptr[BVar2].sdx4df)(puVar29,iVar23,(uint8_t **)shift_x,iVar7,(uint *)shift_y);
        uVar21 = uVar21 * 5;
        auVar47._0_4_ = -(uint)((int)(uVar21 >> 3 | 0x80000000) < (int)(shift_y[0] ^ 0x80000000U));
        auVar47._4_4_ = -(uint)((int)(uVar21 >> 3 | 0x80000000) < (int)(shift_y[1] ^ 0x80000000U));
        auVar47._8_4_ = -(uint)((int)(uVar21 >> 3 | 0x80000000) < (int)(uStack_80 ^ 0x80000000));
        auVar47._12_4_ = -(uint)((int)(uVar21 >> 3 | 0x80000000) < (int)(uStack_7c ^ 0x80000000));
        iVar23 = movmskps(uVar21,auVar47);
        if (iVar23 == 0xf) {
          shift_y[0] = 0;
          shift_x = (int  [2])((ulong)(uint)cpi->source->subsampling_x << 0x20);
          shift_y[1] = cpi->source->subsampling_y;
          bVar3 = block_size_high[BVar1];
          bVar4 = block_size_wide[BVar1];
          for (uVar30 = 0; uVar30 < (ulong)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1;
              uVar30 = uVar30 + 1) {
            uVar27 = (ulong)(uVar30 != 0);
            bVar5 = *(byte *)(shift_y + uVar27);
            iVar28 = mi_row << (2 - bVar5 & 0x1f);
            iVar23 = *(int *)((long)cpi->source->store_buf_adr + uVar27 * 4 + -0x28);
            iVar7 = *(int *)((long)cpi->last_source->store_buf_adr + uVar27 * 4 + -0x28);
            bVar6 = *(byte *)(shift_x + uVar27);
            iVar22 = mi_col << (2 - bVar6 & 0x1f);
            puVar26 = cpi->source->store_buf_adr[uVar30 - 4] + (iVar28 * iVar23 + iVar22);
            puVar29 = cpi->last_source->store_buf_adr[uVar30 - 4] + (iVar28 * iVar7 + iVar22);
            for (uVar21 = 0; uVar21 != bVar3 >> (bVar5 & 0x1f); uVar21 = uVar21 + 1) {
              for (uVar27 = 0; bVar4 >> (bVar6 & 0x1f) != uVar27; uVar27 = uVar27 + 1) {
                puVar26[uVar27] = (uint8_t)((uint)puVar26[uVar27] + (uint)puVar29[uVar27] >> 1);
              }
              puVar26 = puVar26 + iVar23;
              puVar29 = puVar29 + iVar7;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void av1_source_content_sb(AV1_COMP *cpi, MACROBLOCK *x, TileDataEnc *tile_data,
                           int mi_row, int mi_col) {
  if (cpi->last_source->y_width != cpi->source->y_width ||
      cpi->last_source->y_height != cpi->source->y_height)
    return;
#if CONFIG_AV1_HIGHBITDEPTH
  if (x->e_mbd.cur_buf->flags & YV12_FLAG_HIGHBITDEPTH) return;
#endif

  unsigned int tmp_sse;
  unsigned int tmp_variance;
  const BLOCK_SIZE bsize = cpi->common.seq_params->sb_size;
  uint8_t *src_y = cpi->source->y_buffer;
  const int src_ystride = cpi->source->y_stride;
  const int src_offset = src_ystride * (mi_row << 2) + (mi_col << 2);
  uint8_t *last_src_y = cpi->last_source->y_buffer;
  const int last_src_ystride = cpi->last_source->y_stride;
  const int last_src_offset = last_src_ystride * (mi_row << 2) + (mi_col << 2);
  uint64_t avg_source_sse_threshold_verylow = 10000;     // ~1.5*1.5*(64*64)
  uint64_t avg_source_sse_threshold_low[2] = { 100000,   // ~5*5*(64*64)
                                               36000 };  // ~3*3*(64*64)

  uint64_t avg_source_sse_threshold_high = 1000000;  // ~15*15*(64*64)
  if (cpi->sf.rt_sf.increase_source_sad_thresh) {
    avg_source_sse_threshold_high = avg_source_sse_threshold_high << 1;
    avg_source_sse_threshold_low[0] = avg_source_sse_threshold_low[0] << 1;
    avg_source_sse_threshold_verylow = avg_source_sse_threshold_verylow << 1;
  }
  uint64_t sum_sq_thresh = 10000;  // sum = sqrt(thresh / 64*64)) ~1.5
  src_y += src_offset;
  last_src_y += last_src_offset;
  tmp_variance = cpi->ppi->fn_ptr[bsize].vf(src_y, src_ystride, last_src_y,
                                            last_src_ystride, &tmp_sse);
  // rd thresholds
  if (tmp_sse < avg_source_sse_threshold_low[1])
    x->content_state_sb.source_sad_rd = kLowSad;

  // nonrd thresholds
  if (tmp_sse == 0) {
    x->content_state_sb.source_sad_nonrd = kZeroSad;
    return;
  }
  if (tmp_sse < avg_source_sse_threshold_verylow)
    x->content_state_sb.source_sad_nonrd = kVeryLowSad;
  else if (tmp_sse < avg_source_sse_threshold_low[0])
    x->content_state_sb.source_sad_nonrd = kLowSad;
  else if (tmp_sse > avg_source_sse_threshold_high)
    x->content_state_sb.source_sad_nonrd = kHighSad;

  // Detect large lighting change.
  // Note: tmp_sse - tmp_variance = ((sum * sum) >> 12)
  if (tmp_variance < (tmp_sse >> 1) && (tmp_sse - tmp_variance) > sum_sq_thresh)
    x->content_state_sb.lighting_change = 1;
  if ((tmp_sse - tmp_variance) < (sum_sq_thresh >> 1))
    x->content_state_sb.low_sumdiff = 1;

  if (tmp_sse > ((avg_source_sse_threshold_high * 7) >> 3) &&
      !x->content_state_sb.lighting_change && !x->content_state_sb.low_sumdiff)
    x->sb_force_fixed_part = 0;

  if (!cpi->sf.rt_sf.use_rtc_tf || cpi->rc.high_source_sad ||
      cpi->rc.frame_source_sad > 20000 || cpi->svc.number_spatial_layers > 1)
    return;

  // In-place temporal filter. If psnr calculation is enabled, we store the
  // source for that.
  AV1_COMMON *const cm = &cpi->common;
  // Calculate n*mean^2
  const unsigned int nmean2 = tmp_sse - tmp_variance;
  const int ac_q_step = av1_ac_quant_QTX(cm->quant_params.base_qindex, 0,
                                         cm->seq_params->bit_depth);
  const PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const int avg_q_step = av1_ac_quant_QTX(p_rc->avg_frame_qindex[INTER_FRAME],
                                          0, cm->seq_params->bit_depth);

  const unsigned int threshold =
      (cpi->sf.rt_sf.use_rtc_tf == 1)
          ? (clamp(avg_q_step, 250, 1000)) * ac_q_step
          : 250 * ac_q_step;

  // TODO(yunqing): use a weighted sum instead of averaging in filtering.
  if (tmp_variance <= threshold && nmean2 <= 15) {
    // Check neighbor blocks. If neighbor blocks aren't low-motion blocks,
    // skip temporal filtering for this block.
    MB_MODE_INFO **mi = cm->mi_params.mi_grid_base +
                        get_mi_grid_idx(&cm->mi_params, mi_row, mi_col);
    const TileInfo *const tile_info = &tile_data->tile_info;
    const int is_neighbor_blocks_low_motion = check_neighbor_blocks(
        mi, cm->mi_params.mi_stride, tile_info, mi_row, mi_col);
    if (!is_neighbor_blocks_low_motion) return;

    // Only consider 64x64 SB for now. Need to extend to 128x128 for large SB
    // size.
    // Test several nearby points. If non-zero mv exists, don't do temporal
    // filtering.
    const int is_this_blk_low_motion = fast_detect_non_zero_motion(
        cpi, src_y, src_ystride, last_src_y, last_src_ystride, mi_row, mi_col);

    if (!is_this_blk_low_motion) return;

    const int shift_x[2] = { 0, cpi->source->subsampling_x };
    const int shift_y[2] = { 0, cpi->source->subsampling_y };
    const uint8_t h = block_size_high[bsize];
    const uint8_t w = block_size_wide[bsize];

    for (int plane = 0; plane < av1_num_planes(cm); ++plane) {
      uint8_t *src = cpi->source->buffers[plane];
      const int src_stride = cpi->source->strides[plane != 0];
      uint8_t *last_src = cpi->last_source->buffers[plane];
      const int last_src_stride = cpi->last_source->strides[plane != 0];
      src += src_stride * (mi_row << (2 - shift_y[plane != 0])) +
             (mi_col << (2 - shift_x[plane != 0]));
      last_src += last_src_stride * (mi_row << (2 - shift_y[plane != 0])) +
                  (mi_col << (2 - shift_x[plane != 0]));

      for (int i = 0; i < (h >> shift_y[plane != 0]); ++i) {
        for (int j = 0; j < (w >> shift_x[plane != 0]); ++j) {
          src[j] = (last_src[j] + src[j]) >> 1;
        }
        src += src_stride;
        last_src += last_src_stride;
      }
    }
  }
}